

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_geometry_device.cpp
# Opt level: O0

Vec3fa __thiscall embree::mylerp(embree *this,float f,Vec3fa *a,Vec3fa *b)

{
  undefined8 uVar1;
  float fVar2;
  Vec3fa VVar3;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  Vec3fa *b_local;
  Vec3fa *a_local;
  float f_local;
  
  fVar2 = 1.0 - f;
  uVar1 = *(undefined8 *)((long)&a->field_0 + 8);
  local_d8 = (float)*(undefined8 *)&a->field_0;
  fStack_d4 = (float)((ulong)*(undefined8 *)&a->field_0 >> 0x20);
  fStack_d0 = (float)uVar1;
  fStack_cc = (float)((ulong)uVar1 >> 0x20);
  VVar3.field_0.m128[3] = fVar2 * fStack_d4;
  VVar3.field_0.m128[2] = fVar2 * local_d8;
  uVar1 = *(undefined8 *)((long)&b->field_0 + 8);
  local_f8 = (float)*(undefined8 *)&b->field_0;
  fStack_f4 = (float)((ulong)*(undefined8 *)&b->field_0 >> 0x20);
  fStack_f0 = (float)uVar1;
  fStack_ec = (float)((ulong)uVar1 >> 0x20);
  uVar1 = CONCAT44(fVar2 * fStack_d4 + f * fStack_f4,fVar2 * local_d8 + f * local_f8);
  *(undefined8 *)this = uVar1;
  *(ulong *)(this + 8) =
       CONCAT44(fVar2 * fStack_cc + f * fStack_ec,fVar2 * fStack_d0 + f * fStack_f0);
  VVar3.field_0._0_8_ = uVar1;
  return (Vec3fa)VVar3.field_0;
}

Assistant:

Vec3fa mylerp(float f, const Vec3fa& a, const Vec3fa& b) { // FIXME: use lerpr, need to make ISPC lerpr and C++ lerpr compatible first
  return (1.0f-f)*a + f*b;
}